

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O3

int envy_bios_parse_cinema(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  uVar2 = (bios->cinema).offset;
  if (uVar2 == 0) {
    return 0;
  }
  uVar4 = bios->length;
  if (uVar2 < uVar4) {
    (bios->cinema).version = bios->data[(uint)uVar2];
    uVar6 = 0;
  }
  else {
    (bios->cinema).version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    uVar2 = (bios->cinema).offset;
    uVar4 = bios->length;
    uVar6 = 0xfffffff2;
  }
  if ((uint)((ulong)uVar2 + 1) < uVar4) {
    (bios->cinema).hlen = bios->data[(ulong)uVar2 + 1];
    uVar4 = 0;
  }
  else {
    (bios->cinema).hlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    uVar4 = 0xfffffff2;
  }
  uVar4 = uVar4 | uVar6;
  lVar5 = 0x1cd;
  do {
    uVar2 = (bios->cinema).offset;
    if (((int)lVar5 + (uint)uVar2) - 0x1cb < bios->length) {
      *(uint8_t *)((long)&bios->data + lVar5) = bios->data[lVar5 + -0x1cb + (ulong)uVar2];
      uVar6 = 0;
    }
    else {
      *(undefined1 *)((long)&bios->data + lVar5) = 0;
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar6 = 0xfffffff2;
    }
    uVar4 = uVar4 | uVar6;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x1d7);
  iVar3 = -0xe;
  if (uVar4 == 0) {
    envy_bios_block(bios,(uint)(bios->cinema).offset,(uint)(bios->cinema).hlen,"CINEMA",-1);
    uVar4 = (bios->cinema).version - 0x30;
    if ((uVar4 < 0x11) && ((0x10003U >> (uVar4 & 0x1f) & 1) != 0)) {
      bVar1 = (bios->cinema).hlen;
      if (0xb < bVar1) {
        if (bVar1 != 0xc) {
          fprintf(_stderr,"CINEMA table header longer than expected [%d > %d]\n",(ulong)bVar1,0xc);
        }
        (bios->cinema).valid = '\x01';
        return 0;
      }
      fprintf(_stderr,"CINEMA table header too short [%d < %d]\n",(ulong)bVar1,0xc);
    }
    else {
      envy_bios_parse_cinema_cold_1();
    }
    iVar3 = -0x16;
  }
  return iVar3;
}

Assistant:

int envy_bios_parse_cinema (struct envy_bios *bios) {
	struct envy_bios_cinema *cinema = &bios->cinema;
	if (!cinema->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, cinema->offset, &cinema->version);
	err |= bios_u8(bios, cinema->offset+1, &cinema->hlen);
	int i;
	for (i = 0; i < 10; i++)
		err |= bios_u8(bios, cinema->offset+2+i, &cinema->unk02[i]);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, cinema->offset, cinema->hlen, "CINEMA", -1);
	int wanthlen = 0;
	switch (cinema->version) {
		case 0x30:
		case 0x31:
		case 0x40:
			wanthlen = 12;
			break;
		default:
			ENVY_BIOS_ERR("Unknown CINEMA table version %d.%d\n", cinema->version >> 4, cinema->version & 0xf);
			return -EINVAL;
	}
	if (cinema->hlen < wanthlen) {
		ENVY_BIOS_ERR("CINEMA table header too short [%d < %d]\n", cinema->hlen, wanthlen);
		return -EINVAL;
	}
	if (cinema->hlen > wanthlen) {
		ENVY_BIOS_WARN("CINEMA table header longer than expected [%d > %d]\n", cinema->hlen, wanthlen);
	}
	cinema->valid = 1;
	return 0;
}